

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-slab-alloc.c
# Opt level: O0

void ztslaballoc_destroy(ztslaballoc_t *sa)

{
  long *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI != (long *)0x0) {
    for (local_10 = 0; local_10 < (ulong)in_RDI[1]; local_10 = local_10 + 1) {
      free(*(void **)(*in_RDI + local_10 * 8));
    }
    free((void *)*in_RDI);
    free(in_RDI);
  }
  return;
}

Assistant:

void ztslaballoc_destroy(ztslaballoc_t *sa)
{
  size_t i;

  if (sa == NULL)
    return;

  /* FIXME: Free any non-slab allocations */

  /* free all slabs */
  for (i = 0; i < sa->nslablistused; i++)
    free(sa->slablist[i]);

  free(sa->slablist);

  free(sa);
}